

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xtea.c
# Opt level: O0

int mbedtls_xtea_self_test(int verbose)

{
  int iVar1;
  undefined1 local_2c [8];
  mbedtls_xtea_context ctx;
  uchar buf [8];
  int ret;
  int i;
  int verbose_local;
  
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  mbedtls_xtea_init((mbedtls_xtea_context *)local_2c);
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  do {
    if (5 < (int)buf._4_4_) {
      if (verbose != 0) {
        printf(anon_var_dwarf_106f7 + 8);
      }
LAB_0014a2ab:
      mbedtls_xtea_free((mbedtls_xtea_context *)local_2c);
      iVar1._0_1_ = buf[0];
      iVar1._1_1_ = buf[1];
      iVar1._2_1_ = buf[2];
      iVar1._3_1_ = buf[3];
      return iVar1;
    }
    if (verbose != 0) {
      printf("  XTEA test #%d: ",(ulong)(buf._4_4_ + 1));
    }
    ctx.k._8_8_ = xtea_test_pt[(int)buf._4_4_];
    mbedtls_xtea_setup((mbedtls_xtea_context *)local_2c,xtea_test_key[(int)buf._4_4_]);
    mbedtls_xtea_crypt_ecb
              ((mbedtls_xtea_context *)local_2c,1,(uchar *)(ctx.k + 2),(uchar *)(ctx.k + 2));
    if ((uchar  [8])ctx.k._8_8_ != xtea_test_ct[(int)buf._4_4_]) {
      if (verbose != 0) {
        printf("failed\n");
      }
      buf[0] = '\x01';
      buf[1] = '\0';
      buf[2] = '\0';
      buf[3] = '\0';
      goto LAB_0014a2ab;
    }
    if (verbose != 0) {
      printf("passed\n");
    }
    buf._4_4_ = buf._4_4_ + 1;
  } while( true );
}

Assistant:

int mbedtls_xtea_self_test( int verbose )
{
    int i, ret = 0;
    unsigned char buf[8];
    mbedtls_xtea_context ctx;

    mbedtls_xtea_init( &ctx );
    for( i = 0; i < 6; i++ )
    {
        if( verbose != 0 )
            mbedtls_printf( "  XTEA test #%d: ", i + 1 );

        memcpy( buf, xtea_test_pt[i], 8 );

        mbedtls_xtea_setup( &ctx, xtea_test_key[i] );
        mbedtls_xtea_crypt_ecb( &ctx, MBEDTLS_XTEA_ENCRYPT, buf, buf );

        if( memcmp( buf, xtea_test_ct[i], 8 ) != 0 )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed\n" );

            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

exit:
    mbedtls_xtea_free( &ctx );

    return( ret );
}